

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

void lanli_escape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    sVar1 = size;
    if (size < uVar3) {
      sVar1 = uVar3;
    }
    for (; sVar1 != uVar4; uVar4 = uVar4 + 1) {
      sVar2 = uVar4;
      if (""[data[uVar4]] != '\0') goto LAB_0011dd35;
    }
    sVar2 = sVar1;
    if (uVar3 == 0) {
      lanli_buffer_put(ob,data,size);
      return;
    }
LAB_0011dd35:
    if (uVar3 <= sVar2 && sVar2 - uVar3 != 0) {
      lanli_buffer_put(ob,data + uVar3,sVar2 - uVar3);
    }
    if (size <= uVar4) {
      return;
    }
    lanli_buffer_puts(ob,HTML_ESCAPES_rel + *(int *)(HTML_ESCAPES_rel + (ulong)""[data[sVar2]] * 4))
    ;
    uVar3 = sVar2 + 1;
  } while( true );
}

Assistant:

void lanli_escape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && HTML_ESCAPE_TABLE[data[i]] == 0) i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    lanli_buffer_puts(ob, HTML_ESCAPES[HTML_ESCAPE_TABLE[data[i]]]);
    i++;
  }
}